

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlSchemaFacetPtr xmlSchemaNewMinLengthFacet(int value)

{
  int iVar1;
  xmlSchemaValPtr pxVar2;
  anon_union_32_10_af560d0e_for_value *paVar3;
  xmlChar *pxVar4;
  xmlSchemaValDecimal *decimal;
  size_t bufsize;
  xmlSchemaFacetPtr ret;
  xmlSchemaFacetPtr pxStack_10;
  int value_local;
  
  pxStack_10 = xmlSchemaNewFacet();
  if (pxStack_10 == (xmlSchemaFacetPtr)0x0) {
    pxStack_10 = (xmlSchemaFacetPtr)0x0;
  }
  else {
    pxStack_10->type = XML_SCHEMA_FACET_MINLENGTH;
    pxVar2 = xmlSchemaNewValue(XML_SCHEMAS_NNINTEGER);
    pxStack_10->val = pxVar2;
    if (pxStack_10->val == (xmlSchemaValPtr)0x0) {
      (*xmlFree)(pxStack_10);
      pxStack_10 = (xmlSchemaFacetPtr)0x0;
    }
    else {
      iVar1 = snprintf((char *)0x0,0,"%+d.0",(ulong)(uint)value);
      pxVar2 = pxStack_10->val;
      paVar3 = &pxVar2->value;
      pxVar4 = (xmlChar *)(*xmlMalloc)((long)(iVar1 + 1));
      (paVar3->decimal).str = pxVar4;
      if ((paVar3->decimal).str == (xmlChar *)0x0) {
        xmlSchemaFreeFacet(pxStack_10);
        pxStack_10 = (xmlSchemaFacetPtr)0x0;
      }
      else {
        snprintf((char *)(paVar3->decimal).str,(long)(iVar1 + 1),"%+d.0",(ulong)(uint)value);
        (pxVar2->value).decimal.integralPlaces = iVar1 - 3;
        (pxVar2->value).decimal.fractionalPlaces = 1;
      }
    }
  }
  return pxStack_10;
}

Assistant:

static xmlSchemaFacetPtr
xmlSchemaNewMinLengthFacet(int value)
{
    xmlSchemaFacetPtr ret;
    size_t bufsize;
    xmlSchemaValDecimal *decimal;

    ret = xmlSchemaNewFacet();
    if (ret == NULL) {
        return(NULL);
    }
    ret->type = XML_SCHEMA_FACET_MINLENGTH;
    ret->val = xmlSchemaNewValue(XML_SCHEMAS_NNINTEGER);
    if (ret->val == NULL) {
        xmlFree(ret);
        return(NULL);
    }
    bufsize = snprintf(NULL, 0, "%+d.0", value) + 1;
    decimal = &ret->val->value.decimal;
    decimal->str = xmlMalloc(bufsize);
    if (decimal->str == NULL)
    {
        xmlSchemaFreeFacet(ret);
        return NULL;
    }
    snprintf((char *)decimal->str, bufsize, "%+d.0", value);
    decimal->integralPlaces = bufsize - 4;
    decimal->fractionalPlaces = 1;
    return (ret);
}